

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O3

void __thiscall implementations::scheme::SchemeFrame::nextExpression(SchemeFrame *this)

{
  cell *pcVar1;
  element_type *peVar2;
  cell *pcVar3;
  
  pcVar1 = (this->expressions).
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar3 = (this->exp_it)._M_current;
  if (pcVar3 != pcVar1) {
    pcVar3 = pcVar3 + 1;
    (this->exp_it)._M_current = pcVar3;
    if (pcVar3 != pcVar1) {
      setExpression(this,pcVar3);
      this->resolved = false;
      return;
    }
  }
  this->resolved = true;
  (this->exp).type = nil;
  std::__cxx11::string::_M_assign((string *)&(this->exp).val);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  operator=(&(this->exp).list,
            (vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> *
            )&DAT_001313d8);
  peVar2 = _DAT_001313f8;
  (this->exp).proc = _DAT_001313f0;
  (this->exp).env.
  super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->exp).env.
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DAT_00131400);
  return;
}

Assistant:

void nextExpression() {
		if (exp_it != expressions.cend()) {
			++exp_it;
			if (exp_it != expressions.cend()) {
				setExpression(*exp_it);
				resolved = false;
			} else {
				resolved = true;
				exp = nil;
			}
		} else {
			resolved = true;
			exp = nil;
		}
	}